

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

int __thiscall AggressiveBotStrategy::attackToCountryIndex(AggressiveBotStrategy *this)

{
  int iVar1;
  Country *pCVar2;
  reference ppCVar3;
  ulong uVar4;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *this_00;
  unsigned_long i;
  ulong __n;
  value_type pCVar5;
  
  pCVar5 = (value_type)0x0;
  uVar4 = 0;
  __n = 0;
  do {
    this_00 = ((this->super_PlayerStrategy).from)->pAdjCountries;
    if ((ulong)((long)(this_00->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this_00->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
      (this->super_PlayerStrategy).to = pCVar5;
      return (int)uVar4;
    }
    if (pCVar5 == (value_type)0x0) {
      ppCVar3 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(this_00,__n);
      pCVar2 = (this->super_PlayerStrategy).from;
      if (*(*ppCVar3)->pPlayerOwnerId == *pCVar2->pPlayerOwnerId) {
        pCVar5 = (value_type)0x0;
      }
      else {
        ppCVar3 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                            (pCVar2->pAdjCountries,__n);
        pCVar5 = *ppCVar3;
        if (pCVar5 != (value_type)0x0) {
          this_00 = ((this->super_PlayerStrategy).from)->pAdjCountries;
          uVar4 = __n & 0xffffffff;
          goto LAB_00109c6e;
        }
        pCVar5 = (value_type)0x0;
LAB_00109d0c:
        uVar4 = __n & 0xffffffff;
      }
    }
    else {
LAB_00109c6e:
      iVar1 = *pCVar5->pNumberOfTroops;
      ppCVar3 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at(this_00,__n);
      if (*(*ppCVar3)->pNumberOfTroops < iVar1) {
        ppCVar3 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                            (((this->super_PlayerStrategy).from)->pAdjCountries,__n);
        pCVar2 = (this->super_PlayerStrategy).from;
        if (*(*ppCVar3)->pPlayerOwnerId != *pCVar2->pPlayerOwnerId) {
          ppCVar3 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                              (pCVar2->pAdjCountries,__n);
          pCVar5 = *ppCVar3;
          goto LAB_00109d0c;
        }
      }
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

int AggressiveBotStrategy::attackToCountryIndex() {
    Map::Country* smallestNeighbour = nullptr;
    unsigned int index = 0;
    for (unsigned long i = 0; i < from->getAdjCountries()->size(); i++) {
        if (smallestNeighbour == nullptr && from->getAdjCountries()->at(i)->getPlayerOwnerID() != from->getPlayerOwnerID()) {
            smallestNeighbour = from->getAdjCountries()->at(i);
            index = i;
        }
        if (smallestNeighbour != nullptr && smallestNeighbour->getNumberOfTroops() > from->getAdjCountries()->at(i)->getNumberOfTroops() && from->getAdjCountries()->at(i)->getPlayerOwnerID()!= from->getPlayerOwnerID()) {
            smallestNeighbour = from->getAdjCountries()->at(i);
            index = i;
        }
    }

    to = smallestNeighbour;
    return (int) index;
}